

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalfd-test.c
# Opt level: O0

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  ulong uVar1;
  atf_error_t ec_11;
  atf_error_t ec_10;
  atf_error_t ec_9;
  atf_error_t ec_8;
  atf_error_t ec_7;
  atf_error_t ec_6;
  atf_error_t ec_5;
  atf_error_t ec_4;
  atf_error_t ec_3;
  atf_error_t ec_2;
  atf_error_t ec_1;
  atf_error_t ec;
  atf_tp_t *tp_local;
  
  tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__simple_signalfd);
  uVar1 = atf_is_error(tp_local);
  if ((uVar1 & 1) == 0) {
    tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__blocking_read);
    uVar1 = atf_is_error(tp_local);
    if ((uVar1 & 1) == 0) {
      tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__nonblocking_read);
      uVar1 = atf_is_error(tp_local);
      if ((uVar1 & 1) == 0) {
        tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__multiple_signals);
        uVar1 = atf_is_error(tp_local);
        if ((uVar1 & 1) == 0) {
          tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__modify_signalmask);
          uVar1 = atf_is_error(tp_local);
          if ((uVar1 & 1) == 0) {
            tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__argument_checks);
            uVar1 = atf_is_error(tp_local);
            if ((uVar1 & 1) == 0) {
              tp_local = (atf_tp_t *)
                         microatf_tp_add_tc(tp,&microatf_tc_signalfd__signal_disposition);
              uVar1 = atf_is_error(tp_local);
              if ((uVar1 & 1) == 0) {
                tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__sigwaitinfo);
                uVar1 = atf_is_error(tp_local);
                if ((uVar1 & 1) == 0) {
                  tp_local = (atf_tp_t *)
                             microatf_tp_add_tc(tp,&microatf_tc_signalfd__sigwait_openbsd);
                  uVar1 = atf_is_error(tp_local);
                  if ((uVar1 & 1) == 0) {
                    tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__sigchld);
                    uVar1 = atf_is_error(tp_local);
                    if ((uVar1 & 1) == 0) {
                      tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_signalfd__sigwinch);
                      uVar1 = atf_is_error(tp_local);
                      if ((uVar1 & 1) == 0) {
                        tp_local = (atf_tp_t *)
                                   microatf_tp_add_tc(tp,&microatf_tc_signalfd__multiple_readers);
                        uVar1 = atf_is_error(tp_local);
                        if ((uVar1 & 1) == 0) {
                          tp_local = (atf_tp_t *)atf_no_error();
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (atf_error_t)tp_local;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, signalfd__simple_signalfd);
	ATF_TP_ADD_TC(tp, signalfd__blocking_read);
	ATF_TP_ADD_TC(tp, signalfd__nonblocking_read);
	ATF_TP_ADD_TC(tp, signalfd__multiple_signals);
	ATF_TP_ADD_TC(tp, signalfd__modify_signalmask);
	ATF_TP_ADD_TC(tp, signalfd__argument_checks);
	ATF_TP_ADD_TC(tp, signalfd__signal_disposition);
	ATF_TP_ADD_TC(tp, signalfd__sigwaitinfo);
	ATF_TP_ADD_TC(tp, signalfd__sigwait_openbsd);
	ATF_TP_ADD_TC(tp, signalfd__sigchld);
	ATF_TP_ADD_TC(tp, signalfd__sigwinch);
	ATF_TP_ADD_TC(tp, signalfd__multiple_readers);

	return atf_no_error();
}